

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var * __thiscall cs::runtime_type::parse_access_lhs(runtime_type *this,var *a,var *b)

{
  char *pcVar1;
  _Map_pointer ppaVar2;
  _Elt_pointer paVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_00;
  MappedReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> paVar5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_01;
  numeric *pnVar6;
  long lVar7;
  undefined *puVar8;
  undefined4 extraout_var_02;
  runtime_error *prVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  longdouble lVar14;
  const_iterator cVar15;
  anon_union_16_2_310e9938_for_data local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  any local_a8;
  any local_a0;
  ulong local_98;
  undefined2 uStack_90;
  ulong local_80;
  ulong local_70;
  longdouble local_68;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_50;
  _Head_base<0UL,_cs_impl::any_&&,_false> local_48;
  _Head_base<0UL,_cs::numeric_&&,_false> local_40;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_38;
  
  if (a->mDat == (proxy *)0x0) {
    puVar8 = &void::typeinfo;
  }
  else {
    iVar4 = (*a->mDat->data->_vptr_baseHolder[2])();
    puVar8 = (undefined *)CONCAT44(extraout_var,iVar4);
  }
  pcVar1 = *(char **)(puVar8 + 8);
  if ((pcVar1 != "St5dequeIN7cs_impl3anyESaIS1_EE") &&
     ((*pcVar1 == '*' || (iVar4 = strcmp(pcVar1,"St5dequeIN7cs_impl3anyESaIS1_EE"), iVar4 != 0)))) {
    if (a->mDat == (proxy *)0x0) {
      puVar8 = &void::typeinfo;
    }
    else {
      iVar4 = (*a->mDat->data->_vptr_baseHolder[2])();
      puVar8 = (undefined *)CONCAT44(extraout_var_00,iVar4);
    }
    pcVar1 = *(char **)(puVar8 + 8);
    if ((pcVar1 != 
         "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
        ) && ((*pcVar1 == '*' ||
              (iVar4 = strcmp(pcVar1,
                              "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
                             ), iVar4 != 0)))) {
      if (a->mDat == (proxy *)0x0) {
        puVar8 = &void::typeinfo;
      }
      else {
        iVar4 = (*a->mDat->data->_vptr_baseHolder[2])();
        puVar8 = (undefined *)CONCAT44(extraout_var_02,iVar4);
      }
      pcVar1 = *(char **)(puVar8 + 8);
      if ((pcVar1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
         ((*pcVar1 == '*' ||
          (iVar4 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar4 != 0
          )))) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_c8._int = (numeric_integer)&local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Access non-array or string object.","");
        runtime_error::runtime_error(prVar9,(string *)&local_c8);
        __cxa_throw(prVar9,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_c8._int = (numeric_integer)&local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Access string object as lvalue.","");
      runtime_error::runtime_error(prVar9,(string *)&local_c8);
      __cxa_throw(prVar9,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *)cs_impl::any::
                 val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                           (a);
    cVar15 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             ::find<cs_impl::any>(this_00,b);
    if (cVar15.inner_.ctrl_ == this_00->ctrl_ + this_00->capacity_) {
      local_a8.mDat = b->mDat;
      if (local_a8.mDat != (proxy *)0x0) {
        (local_a8.mDat)->refcount = (local_a8.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_a0,(EVP_PKEY_CTX *)&local_a8);
      local_40._M_head_impl = (numeric *)&local_c8;
      local_b8._M_local_buf[0] = '\x01';
      local_c8._int = 0;
      local_50 = this_00;
      local_48._M_head_impl = &local_a0;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
      ::EmplaceDecomposable::operator()
                (&local_38,&local_50,&local_a0,(piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<cs_impl::any_&&> *)&local_48,(tuple<cs::numeric_&&> *)&local_40);
      cs_impl::any::recycle(&local_a0);
      cs_impl::any::recycle(&local_a8);
    }
    paVar5 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
             ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                         *)this_00,b);
    return paVar5;
  }
  if (b->mDat == (proxy *)0x0) {
    puVar8 = &void::typeinfo;
  }
  else {
    iVar4 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar8 = (undefined *)CONCAT44(extraout_var_01,iVar4);
  }
  pcVar1 = *(char **)(puVar8 + 8);
  if ((pcVar1 != "N2cs7numericE") &&
     ((*pcVar1 == '*' || (iVar4 = strcmp(pcVar1,"N2cs7numericE"), iVar4 != 0)))) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_c8._int = (numeric_integer)&local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Index must be a numeric.","");
    runtime_error::runtime_error(prVar9,(string *)&local_c8);
    __cxa_throw(prVar9,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  this_01 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(a);
  pnVar6 = cs_impl::any::const_val<cs::numeric>(b);
  if (pnVar6->type == true) {
    if ((pnVar6->data)._int < 0) {
LAB_00136506:
      pnVar6 = cs_impl::any::const_val<cs::numeric>(b);
      if (pnVar6->type == true) {
        local_98 = -(pnVar6->data)._int;
        uStack_90 = 0;
        lVar14 = (longdouble)(unkuint10)local_98;
      }
      else {
        lVar14 = -*(longdouble *)&pnVar6->data;
      }
      ppaVar2 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar11 = ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)ppaVar2 -
                         (long)(this_01->
                               super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppaVar2 == (_Map_pointer)0x0)) * 0x40;
      if (pnVar6->type == false) {
        local_70 = uVar11;
        if ((longdouble)(long)uVar11 +
            (longdouble)*(float *)(&DAT_001e7080 + (ulong)((long)uVar11 < 0) * 4) < lVar14)
        goto LAB_0013665f;
      }
      else {
        local_68._0_8_ = SUB108(lVar14,0);
        bVar13 = uVar11 < local_68._0_8_;
        local_68 = lVar14;
        if (bVar13) {
LAB_0013665f:
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_c8._int = (numeric_integer)&local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Out of range.","");
          runtime_error::runtime_error(prVar9,(string *)&local_c8);
          __cxa_throw(prVar9,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
      }
      pnVar6 = cs_impl::any::const_val<cs::numeric>(b);
      lVar7 = (long)ROUND(*(longdouble *)&pnVar6->data);
      if (pnVar6->type != false) {
        lVar7 = (pnVar6->data)._int;
      }
      uVar11 = lVar7 + uVar11;
      goto LAB_001366bd;
    }
  }
  else if (*(longdouble *)&pnVar6->data < (longdouble)0) goto LAB_00136506;
  pnVar6 = cs_impl::any::const_val<cs::numeric>(b);
  local_80 = (ulong)ROUND(*(longdouble *)&pnVar6->data);
  uVar11 = local_80;
  if (pnVar6->type != false) {
    uVar11 = (pnVar6->data)._int;
  }
  ppaVar2 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  lVar7 = ((((ulong)((long)ppaVar2 -
                    (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppaVar2 == (_Map_pointer)0x0)) * 0x40;
  lVar10 = ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_last -
            (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur -
            (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_first >> 3);
  uVar12 = lVar7 + lVar10;
  if ((uVar12 <= uVar11) && (uVar11 - uVar12 != -1)) {
    uVar12 = (lVar7 + lVar10) - 1;
    do {
      local_b8._M_local_buf[0] = '\x01';
      local_c8._int = 0;
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                (this_01,(numeric *)&local_c8);
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
LAB_001366bd:
  paVar3 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  uVar12 = ((long)paVar3 -
            (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 3) + uVar11;
  if ((long)uVar12 < 0) {
    uVar11 = (long)uVar12 >> 6;
  }
  else {
    if (uVar12 < 0x40) {
      return paVar3 + uVar11;
    }
    uVar11 = uVar12 >> 6;
  }
  return (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
         super__Deque_impl_data._M_start._M_node[uVar11] + uVar12 + uVar11 * -0x40;
}

Assistant:

var &runtime_type::parse_access_lhs(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			auto &arr = a.val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= arr.size()) {
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > arr.size())
					throw runtime_error("Out of range.");
				posit = arr.size() + b.const_val<numeric>().as_integer();
			}
			return arr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			auto &map = a.val<hash_map>();
			if (map.count(b) == 0)
				map.emplace(copy(b), numeric(0));
			return map.at(b);
		}
		else if (a.type() == typeid(string))
			throw runtime_error("Access string object as lvalue.");
		else
			throw runtime_error("Access non-array or string object.");
	}